

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O1

QString * __thiscall
CsvModelSerialiserPrivate::unescapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *exc)

{
  long lVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  qsizetype qVar4;
  QArrayData *local_48;
  char16_t *local_40;
  undefined8 local_38;
  QString local_30;
  
  lVar1 = (exc->d).size;
  if (lVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (exc->d).d;
    (exc->d).d = (Data *)0x0;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).ptr = (exc->d).ptr;
    (exc->d).ptr = pcVar2;
    qVar4 = (__return_storage_ptr__->d).size;
    qVar3 = 0;
  }
  else {
    pcVar2 = (exc->d).ptr;
    if ((*pcVar2 == L'\"') && (pcVar2[lVar1 + -1] == L'\"')) {
      QString::chop((longlong)exc);
      QString::remove((longlong)exc,0);
      local_30.d.d = (Data *)0x0;
      local_30.d.ptr = L"\"\"";
      local_30.d.size = 2;
      local_48 = (QArrayData *)0x0;
      local_40 = L"\"";
      local_38 = 1;
      QString::replace(exc,&local_30,(CaseSensitivity)&local_48);
      if (local_48 != (QArrayData *)0x0) {
        LOCK();
        (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_48,2,8);
        }
      }
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,8);
        }
      }
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (exc->d).d;
    (exc->d).d = (Data *)0x0;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).ptr = (exc->d).ptr;
    (exc->d).ptr = pcVar2;
    qVar4 = (__return_storage_ptr__->d).size;
    qVar3 = (exc->d).size;
  }
  (__return_storage_ptr__->d).size = qVar3;
  (exc->d).size = qVar4;
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::unescapedCSV(QString exc) const
{
    if (exc.isEmpty())
        return exc;
    if (*exc.constBegin() == QLatin1Char('\"') && *(exc.constEnd() - 1) == QLatin1Char('\"')) {
        exc.chop(1);
        exc.remove(0, 1);
        exc.replace(QStringLiteral("\"\""), QStringLiteral("\""));
    }
    return exc;
}